

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void FDrawInfo::EndDrawInfo(void)

{
  FDrawInfo *di_00;
  int local_18;
  int local_14;
  int i_1;
  int i;
  FDrawInfo *di;
  
  di_00 = gl_drawinfo;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    GLDrawList::Reset(di_00->drawlists + local_14);
  }
  if (di_00->dldrawlists != (GLDrawList *)0x0) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      GLDrawList::Reset(di_00->dldrawlists + local_18);
    }
  }
  gl_drawinfo = di_00->next;
  FDrawInfoList::Release(&di_list,di_00);
  return;
}

Assistant:

void FDrawInfo::EndDrawInfo()
{
	FDrawInfo * di = gl_drawinfo;

	for(int i=0;i<GLDL_TYPES;i++) di->drawlists[i].Reset();
	if (di->dldrawlists != NULL)
	{
		for (int i = 0; i < GLLDL_TYPES; i++) di->dldrawlists[i].Reset();
	}
	gl_drawinfo=di->next;
	di_list.Release(di);
}